

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O2

Expression * __thiscall
wasm::SafeHeap::makeBoundsCheck
          (SafeHeap *this,Type type,Builder *builder,Index ptrLocal,Index sumLocal,Index bytes,
          Module *module,Type addressType,bool is64,Name memory)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  BinaryOp op;
  BinaryOp op_00;
  Index index;
  Load *pLVar4;
  LocalGet *pLVar5;
  Const *pCVar6;
  Binary *pBVar7;
  LocalGet *right;
  Binary *right_00;
  Call *pCVar8;
  Expression *right_01;
  Block *ifTrue;
  If *pIVar9;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args;
  int iVar10;
  uint bytes_00;
  BinaryOp op_01;
  ulong uVar11;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  Name name;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  Const *local_88;
  SafeHeap *local_80;
  ulong local_78;
  Load *local_70;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_68;
  Index local_48;
  Index local_44;
  Binary *local_40;
  Index local_38;
  allocator_type local_31;
  
  pcVar2 = (this->sbrk).super_IString.str._M_str;
  bVar1 = (((this->super_Pass).runner)->options).lowMemoryUnused;
  local_78 = (ulong)bVar1;
  iVar10 = (uint)bVar1 + (uint)bVar1 * 2 + 0xf;
  if (is64) {
    iVar10 = (uint)bVar1 + (uint)bVar1 * 2 + 0x28;
  }
  local_40 = (Binary *)CONCAT44(local_40._4_4_,iVar10);
  local_80 = this;
  local_48 = ptrLocal;
  local_44 = bytes;
  local_38 = sumLocal;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (this->dynamicTopPtr).super_IString.str._M_str;
    if (pcVar2 == (char *)0x0) {
      local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pCVar8 = Builder::makeCall(builder,(Name)(this->getSbrkPtr).super_IString.str,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 &local_68,addressType,false);
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                (&local_68);
    }
    else {
      name.super_IString.str._M_str = pcVar2;
      name.super_IString.str._M_len = (this->dynamicTopPtr).super_IString.str._M_len;
      pCVar8 = (Call *)Builder::makeGlobalGet(builder,name,addressType);
    }
    bytes_00 = (uint)is64 * 4 + 4;
    local_70 = Builder::makeLoad(builder,bytes_00,false,(Address)0x0,bytes_00,(Expression *)pCVar8,
                                 addressType,memory);
  }
  else {
    sVar3 = (this->sbrk).super_IString.str._M_len;
    local_88 = Builder::makeConstPtr(builder,0,addressType);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_88;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_68,__l,
               &local_31);
    target.super_IString.str._M_str = pcVar2;
    target.super_IString.str._M_len = sVar3;
    pLVar4 = (Load *)Builder::makeCall(builder,target,
                                       (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                        *)&local_68,addressType,false);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              (&local_68);
    local_70 = pLVar4;
  }
  index = local_38;
  pLVar5 = Builder::makeLocalGet(builder,local_38,addressType);
  pCVar6 = Builder::makeConstPtr(builder,(local_78 & 0xff) << 10,addressType);
  local_40 = Builder::makeBinary(builder,(BinaryOp)local_40,(Expression *)pLVar5,
                                 (Expression *)pCVar6);
  pLVar5 = Builder::makeLocalGet(builder,index,addressType);
  pCVar6 = Builder::makeConstPtr(builder,(ulong)local_44,addressType);
  op = GtUInt32;
  if (is64) {
    op = GtUInt64;
  }
  op_01 = AddInt64;
  if (!is64) {
    op_01 = AddInt32;
  }
  op_00 = LtUInt32;
  if (is64) {
    op_00 = LtUInt64;
  }
  pBVar7 = Builder::makeBinary(builder,op_01,(Expression *)pLVar5,(Expression *)pCVar6);
  pBVar7 = Builder::makeBinary(builder,op,(Expression *)pBVar7,(Expression *)local_70);
  pLVar5 = Builder::makeLocalGet(builder,local_38,addressType);
  right = Builder::makeLocalGet(builder,local_48,addressType);
  right_00 = Builder::makeBinary(builder,op_00,(Expression *)pLVar5,(Expression *)right);
  pBVar7 = Builder::makeBinary(builder,OrInt32,(Expression *)pBVar7,(Expression *)right_00);
  pBVar7 = Builder::makeBinary(builder,OrInt32,(Expression *)local_40,(Expression *)pBVar7);
  args = &local_68;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar8 = Builder::makeCall(builder,(Name)(local_80->segfault).super_IString.str,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)args
                             ,(Type)0x0,false);
  right_01 = (Expression *)Builder::makeUnreachable(builder);
  uVar11 = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)args;
  ifTrue = Builder::makeSequence(builder,(Expression *)pCVar8,right_01,type_00);
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar11;
  pIVar9 = Builder::makeIf(builder,(Expression *)pBVar7,(Expression *)ifTrue,(Expression *)0x0,
                           type_01);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_68);
  return (Expression *)pIVar9;
}

Assistant:

Expression* makeBoundsCheck(Type type,
                              Builder& builder,
                              Index ptrLocal,
                              Index sumLocal,
                              Index bytes,
                              Module* module,
                              Type addressType,
                              bool is64,
                              Name memory) {
    bool lowMemUnused = getPassOptions().lowMemoryUnused;
    auto upperOp = is64 ? lowMemUnused ? LtUInt64 : EqInt64
                        : lowMemUnused ? LtUInt32 : EqInt32;
    auto upperBound = lowMemUnused ? PassOptions::LowMemoryBound : 0;
    Expression* brkLocation;
    if (sbrk.is()) {
      brkLocation = builder.makeCall(
        sbrk, {builder.makeConstPtr(0, addressType)}, addressType);
    } else {
      Expression* sbrkPtr;
      if (dynamicTopPtr.is()) {
        sbrkPtr = builder.makeGlobalGet(dynamicTopPtr, addressType);
      } else {
        sbrkPtr = builder.makeCall(getSbrkPtr, {}, addressType);
      }
      auto size = is64 ? 8 : 4;
      brkLocation =
        builder.makeLoad(size, false, 0, size, sbrkPtr, addressType, memory);
    }
    auto gtuOp = is64 ? GtUInt64 : GtUInt32;
    auto addOp = is64 ? AddInt64 : AddInt32;
    auto* upperCheck =
      builder.makeBinary(upperOp,
                         builder.makeLocalGet(sumLocal, addressType),
                         builder.makeConstPtr(upperBound, addressType));
    auto* lowerCheck = builder.makeBinary(
      gtuOp,
      builder.makeBinary(addOp,
                         builder.makeLocalGet(sumLocal, addressType),
                         builder.makeConstPtr(bytes, addressType)),
      brkLocation);
    // Check for an overflow when adding the pointer and the size, using the
    // rule that for any unsigned x and y,
    //    x + y < x    <=>   x + y overflows
    auto* overflowCheck =
      builder.makeBinary(is64 ? LtUInt64 : LtUInt32,
                         builder.makeLocalGet(sumLocal, addressType),
                         builder.makeLocalGet(ptrLocal, addressType));
    // Add an unreachable right after the call to segfault for performance
    // reasons: the call never returns, and this helps optimizations benefit
    // from that.
    return builder.makeIf(
      builder.makeBinary(
        OrInt32,
        upperCheck,
        builder.makeBinary(OrInt32, lowerCheck, overflowCheck)),
      builder.makeSequence(builder.makeCall(segfault, {}, Type::none),
                           builder.makeUnreachable()));
  }